

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogUdp.cpp
# Opt level: O2

void __thiscall liblogger::LogUdp::Log(LogUdp *this,LogType Type,string *str)

{
  pointer pcVar1;
  uint uVar2;
  int iVar3;
  string *psVar4;
  size_t sVar5;
  ostream *poVar6;
  int *piVar7;
  char *pcVar8;
  LogException *pLVar9;
  char *msg;
  string local_2a0;
  time_t current;
  stringstream ss;
  ostream local_268 [376];
  tm timeinfo;
  char buf [128];
  
  msg = (char *)0x0;
  current = time((time_t *)0x0);
  localtime_r(&current,(tm *)&timeinfo);
  strftime(buf,0x80,"%F %T",(tm *)&timeinfo);
  psVar4 = LogTypeToStr_abi_cxx11_(Type);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  uVar2 = getpid();
  iVar3 = asprintf(&msg,"%s - %s [PID: %d] - %s\n",buf,pcVar1,(ulong)uVar2,(str->_M_dataplus)._M_p);
  pcVar8 = msg;
  if (iVar3 < 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar6 = std::operator<<(local_268,"asprintf failed error:");
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    std::operator<<(poVar6,pcVar8);
    if (this->m_ignoreerrors != true) {
      pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(pLVar9,&local_2a0);
      __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
    }
  }
  else {
    sVar5 = strlen(msg);
    iVar3 = (int)sVar5;
    sVar5 = send(this->m_fd,pcVar8,(long)iVar3,0);
    if ((long)sVar5 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_268,"write failed error:");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      std::operator<<(poVar6,pcVar8);
      free(msg);
      if (this->m_ignoreerrors != true) {
        pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar9,&local_2a0);
        __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
      }
    }
    else {
      if (sVar5 == (long)iVar3) {
        free(msg);
        return;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<(local_268,"Short write only wrote ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      poVar6 = std::operator<<(poVar6," instead of ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar3);
      poVar6 = std::operator<<(poVar6," error:");
      piVar7 = __errno_location();
      pcVar8 = strerror(*piVar7);
      std::operator<<(poVar6,pcVar8);
      free(msg);
      if (this->m_ignoreerrors != true) {
        pLVar9 = (LogException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LogException::LogException(pLVar9,&local_2a0);
        __cxa_throw(pLVar9,&LogException::typeinfo,LogException::~LogException);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void LogUdp::Log(const LogType Type, const std::string &str) {
	char *msg = NULL;

	time_t current = time(NULL);
	struct tm timeinfo;
	char buf[128];

	localtime_r(&current, &timeinfo);
	strftime(buf, sizeof(buf), "%F %T", &timeinfo);

	if (asprintf(&msg, "%s - %s [PID: %d] - %s\n", buf, LogTypeToStr(Type).c_str(), getpid(), str.c_str()) < 0)
	{
		std::stringstream ss;
		ss << "asprintf failed error:" << strerror(errno);
		if (m_ignoreerrors)
			return;
		throw(LogException(ss.str()));
	}
	else
	{
		int len = strlen(msg);
		ssize_t ret = send(m_fd, msg, len, 0);
		if (ret < 0)
		{
			std::stringstream ss;
			ss << "write failed error:" << strerror(errno);
			free(msg);
			if (m_ignoreerrors)
				return;
			throw(LogException(ss.str()));
		}
		if (ret != len)
		{
			std::stringstream ss;
			ss << "Short write only wrote " << ret << " instead of " << len << " error:" << strerror(errno);
			free(msg);
			if (m_ignoreerrors)
				return;
			throw(LogException(ss.str()));
		}
	}
	free(msg);
}